

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O2

HT_EventKlassId __thiscall
HawkTracer::parser::KlassRegister::get_klass_id(KlassRegister *this,string *name)

{
  __type _Var1;
  HT_EventKlassId HVar2;
  __node_base *p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::mutex::lock(&this->_register_mtx);
  p_Var3 = &(this->_register)._M_h._M_before_begin;
  HVar2 = 0xffffffff;
  do {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) goto LAB_00112a52;
    std::__cxx11::string::string
              ((string *)&local_50,
               (string *)
               (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor + 8
               ));
    _Var1 = std::operator==(&local_50,name);
    std::__cxx11::string::~string((string *)&local_50);
  } while (!_Var1);
  HVar2 = *(HT_EventKlassId *)
           &(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor)[0xc].
            _M_nxt;
LAB_00112a52:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return HVar2;
}

Assistant:

HT_EventKlassId KlassRegister::get_klass_id(const std::string& name) const
{
    lock_guard l(_register_mtx);
    for (const auto& klass : _register)
    {
        if (klass.second->get_name() == name)
        {
            return klass.second->get_id();
        }
    }

    return HT_INVALID_KLASS_ID;
}